

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# failure_signal_handler.cc
# Opt level: O0

void absl::lts_20240722::InstallOneFailureHandler
               (FailureSignalData *data,_func_void_int_siginfo_t_ptr_void_ptr *handler)

{
  uint uVar1;
  int iVar2;
  char *absl_raw_log_internal_basename;
  sigaction act;
  _func_void_int_siginfo_t_ptr_void_ptr *handler_local;
  FailureSignalData *data_local;
  
  act.sa_restorer = (_func_void *)handler;
  memset(&absl_raw_log_internal_basename,0,0x98);
  sigemptyset((sigset_t *)&act);
  act.sa_mask.__val[0xf]._0_4_ = (uint)act.sa_mask.__val[0xf] | 0x40000004;
  if ((DAT_001065a9 & 1) != 0) {
    uVar1 = MaybeSetupAlternateStack();
    act.sa_mask.__val[0xf]._0_4_ = uVar1 | (uint)act.sa_mask.__val[0xf];
  }
  absl_raw_log_internal_basename = (char *)act.sa_restorer;
  iVar2 = sigaction(data->signo,(sigaction *)&absl_raw_log_internal_basename,
                    (sigaction *)&data->previous_action);
  if (iVar2 == 0) {
    return;
  }
  absl::lts_20240722::raw_log_internal::RawLog
            (kFatal,"failure_signal_handler.cc",0xe2,"Check %s failed: %s",
             "sigaction(data->signo, &act, &data->previous_action) == 0","sigaction() failed",
             "failure_signal_handler.cc");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/debugging/failure_signal_handler.cc"
                ,0xe2,
                "void absl::InstallOneFailureHandler(FailureSignalData *, void (*)(int, siginfo_t *, void *))"
               );
}

Assistant:

static void InstallOneFailureHandler(FailureSignalData* data,
                                     void (*handler)(int, siginfo_t*, void*)) {
  struct sigaction act;
  memset(&act, 0, sizeof(act));
  sigemptyset(&act.sa_mask);
  act.sa_flags |= SA_SIGINFO;
  // SA_NODEFER is required to handle SIGABRT from
  // ImmediateAbortSignalHandler().
  act.sa_flags |= SA_NODEFER;
  if (fsh_options.use_alternate_stack) {
    act.sa_flags |= MaybeSetupAlternateStack();
  }
  act.sa_sigaction = handler;
  ABSL_RAW_CHECK(sigaction(data->signo, &act, &data->previous_action) == 0,
                 "sigaction() failed");
}